

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O0

KeyIndexStorage * __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>::
exportKeys(KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
           *this,uint batchSize,string *keysFilename)

{
  bool bVar1;
  uint uVar2;
  OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  *this_00;
  undefined4 in_EDX;
  __normal_iterator<const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_*,_std::vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
  in_RSI;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  *in_RDI;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  keys;
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
  it;
  KeyIndexStorage *sortedIndex;
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
  *in_stack_fffffffffffffee8;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  *this_01;
  path *in_stack_fffffffffffffef0;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  *this_02;
  __normal_iterator<const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_*,_std::vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
  in_stack_ffffffffffffff10;
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
  local_e8;
  KeyValue<supermap::Key<1UL>,_unsigned_int> *local_d0;
  KeyValue<supermap::Key<1UL>,_unsigned_int> *local_c8;
  format in_stack_ffffffffffffff47;
  unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
  in_stack_ffffffffffffff48;
  path *in_stack_ffffffffffffff50;
  undefined1 local_a0 [40];
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  *in_stack_ffffffffffffff88;
  
  this_02 = in_RDI;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffff50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff48._M_t.
             super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
             .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl,
             in_stack_ffffffffffffff47);
  getFileManager(in_stack_fffffffffffffee8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
              *)this_02,
             (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
              *)in_RDI);
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  ::SingleFileIndexedStorage
            (this_02,(path *)in_RDI,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffef0,
             (InnerRegisterSupplier *)in_stack_fffffffffffffee8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
               *)0x177ad0);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x177add);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffef0);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,unsigned_int,void>
  ::
  getCustomDataIterator<supermap::StorageValueIgnorer<supermap::Key<1ul>,supermap::ByteArray<1ul>>>
            (in_stack_ffffffffffffff88);
  io::
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<1ul>,supermap::ByteArray<1ul>>,unsigned_int,2ul,void>
  ::
  collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_int,void>::exportKeys(unsigned_int,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<1ul>,supermap::ByteArray<1ul>>&&,unsigned_int)_1_,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>
            ((InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
              *)&stack0xffffffffffffff48,local_a0,in_EDX);
  this_00 = (OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
             *)OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
               ::getRegister((OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                              *)in_RDI);
  uVar2 = OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
          ::getItemsCount(this_00);
  (*this_00->_vptr_OrderedStorage[5])(this_00,(ulong)uVar2);
  while (bVar1 = std::
                 vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                 ::empty((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                          *)this_02), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_01 = (vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
               *)&stack0xffffffffffffff48;
    local_c8 = (KeyValue<supermap::Key<1UL>,_unsigned_int> *)
               std::
               vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
               ::cbegin(this_01);
    local_d0 = (KeyValue<supermap::Key<1UL>,_unsigned_int> *)
               std::
               vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
               ::cend(this_01);
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>
    ::
    appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>const*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,void>
              (&this_02->
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
               ,in_stack_ffffffffffffff10,in_RSI);
    io::
    InputIterator<supermap::StorageValueIgnorer<supermap::Key<1ul>,supermap::ByteArray<1ul>>,unsigned_int,2ul,void>
    ::
    collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_int,void>::exportKeys(unsigned_int,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<1ul>,supermap::ByteArray<1ul>>&&,unsigned_int)_2_,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>
              (&local_e8,local_a0,in_EDX);
    std::
    vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
    ::operator=((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                 *)this_02,
                (vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                 *)in_RDI);
    std::
    vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
    ::~vector((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
               *)this_02);
  }
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ::~vector((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
             *)this_02);
  io::
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
  ::~InputIterator((InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
                    *)0x177c8a);
  return this_02;
}

Assistant:

KeyIndexStorage exportKeys(IndexT batchSize, const std::string &keysFilename) {
        KeyIndexStorage sortedIndex(keysFilename, getFileManager(), innerRegisterSupplier_);
        auto it = sortedStorage_.template getCustomDataIterator<ValueIgnorer>();
        auto keys = it.collectWith([](ValueIgnorer &&kvi, IndexT ind) {
            return KeyIndex{std::move(kvi.key), ind};
        }, batchSize);
        sortedIndex.getRegister().reserve(sortedStorage_.getItemsCount());
        while (!keys.empty()) {
            sortedIndex.appendAll(keys.cbegin(), keys.cend());
            keys = it.collectWith([](ValueIgnorer &&kvi, IndexT ind) {
                return KeyIndex{std::move(kvi.key), ind};
            }, batchSize);
        }
        return sortedIndex;
    }